

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b.c
# Opt level: O2

void blake2b_compress(blake2b_state *S,uint8_t *block)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint64_t m [16];
  ulong local_198;
  ulong local_180;
  ulong local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  ulong local_138 [8];
  ulong local_f8 [8];
  long alStack_b8 [17];
  
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    alStack_b8[lVar1] = *(long *)(block + lVar1 * 8);
  }
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    local_138[lVar1] = S->h[lVar1];
  }
  local_168 = S->t[0] ^ 0x510e527fade682d1;
  local_160 = S->t[1] ^ 0x9b05688c2b3e6c1f;
  local_f8[6] = S->f[0] ^ 0x1f83d9abfb41bd6b;
  local_158 = S->f[1] ^ 0x5be0cd19137e2179;
  local_180 = local_138[1];
  local_178 = local_138[2];
  local_170 = local_138[3];
  local_f8[0] = 0x6a09e667f3bcc908;
  local_198 = 0xbb67ae8584caa73b;
  local_150 = 0x3c6ef372fe94f82b;
  local_148 = 0xa54ff53a5f1d36f1;
  for (lVar1 = 0x3c; lVar1 != 0x33c; lVar1 = lVar1 + 0x40) {
    uVar5 = local_138[0] + local_138[4] + alStack_b8[*(uint *)((long)blake2b_IV + lVar1 + 4)];
    local_168 = local_168 ^ uVar5;
    uVar11 = local_168 << 0x20 | local_168 >> 0x20;
    local_f8[0] = local_f8[0] + uVar11;
    uVar2 = local_138[4] ^ local_f8[0];
    uVar2 = uVar2 << 0x28 | uVar2 >> 0x18;
    uVar6 = uVar5 + uVar2 + alStack_b8[*(uint *)((long)blake2b_IV + lVar1 + 8)];
    uVar11 = uVar11 ^ uVar6;
    uVar12 = uVar11 << 0x30 | uVar11 >> 0x10;
    local_f8[0] = local_f8[0] + uVar12;
    uVar2 = uVar2 ^ local_f8[0];
    uVar5 = uVar2 << 1 | (ulong)((long)uVar2 < 0);
    uVar13 = local_180 + local_138[5] + alStack_b8[*(uint *)((long)blake2b_IV + lVar1 + 0xc)];
    local_160 = local_160 ^ uVar13;
    uVar2 = local_160 << 0x20 | local_160 >> 0x20;
    local_198 = local_198 + uVar2;
    uVar11 = local_138[5] ^ local_198;
    uVar11 = uVar11 << 0x28 | uVar11 >> 0x18;
    uVar14 = uVar13 + uVar11 + alStack_b8[*(uint *)((long)blake2b_IV + lVar1 + 0x10)];
    uVar2 = uVar2 ^ uVar14;
    uVar4 = uVar2 << 0x30 | uVar2 >> 0x10;
    local_198 = local_198 + uVar4;
    uVar11 = uVar11 ^ local_198;
    uVar10 = uVar11 << 1 | (ulong)((long)uVar11 < 0);
    uVar11 = local_178 + local_138[6] + alStack_b8[*(uint *)((long)blake2b_IV + lVar1 + 0x14)];
    local_f8[6] = local_f8[6] ^ uVar11;
    uVar2 = local_f8[6] << 0x20 | local_f8[6] >> 0x20;
    local_150 = local_150 + uVar2;
    uVar13 = local_138[6] ^ local_150;
    uVar13 = uVar13 << 0x28 | uVar13 >> 0x18;
    uVar3 = uVar11 + uVar13 + alStack_b8[*(uint *)((long)blake2b_IV + lVar1 + 0x18)];
    uVar2 = uVar2 ^ uVar3;
    uVar2 = uVar2 << 0x30 | uVar2 >> 0x10;
    local_150 = local_150 + uVar2;
    uVar13 = uVar13 ^ local_150;
    uVar9 = uVar13 << 1 | (ulong)((long)uVar13 < 0);
    uVar7 = local_170 + local_138[7] + alStack_b8[*(uint *)((long)blake2b_IV + lVar1 + 0x1c)];
    local_158 = local_158 ^ uVar7;
    uVar11 = local_158 << 0x20 | local_158 >> 0x20;
    local_148 = local_148 + uVar11;
    uVar13 = local_138[7] ^ local_148;
    uVar13 = uVar13 << 0x28 | uVar13 >> 0x18;
    uVar8 = uVar7 + uVar13 + alStack_b8[*(uint *)((long)blake2b_IV + lVar1 + 0x20)];
    uVar11 = uVar11 ^ uVar8;
    uVar11 = uVar11 << 0x30 | uVar11 >> 0x10;
    local_148 = local_148 + uVar11;
    uVar13 = uVar13 ^ local_148;
    uVar7 = uVar13 << 1 | (ulong)((long)uVar13 < 0);
    uVar6 = uVar6 + uVar10 + alStack_b8[*(uint *)((long)blake2b_IV + lVar1 + 0x24)];
    uVar11 = uVar11 ^ uVar6;
    uVar13 = uVar11 << 0x20 | uVar11 >> 0x20;
    local_150 = local_150 + uVar13;
    uVar10 = uVar10 ^ local_150;
    uVar10 = uVar10 << 0x28 | uVar10 >> 0x18;
    local_138[0] = uVar6 + uVar10 + alStack_b8[*(uint *)((long)blake2b_IV + lVar1 + 0x28)];
    uVar11 = uVar14 + uVar9 + alStack_b8[*(uint *)((long)blake2b_IV + lVar1 + 0x2c)];
    uVar12 = uVar12 ^ uVar11;
    uVar12 = uVar12 << 0x20 | uVar12 >> 0x20;
    local_148 = local_148 + uVar12;
    uVar9 = uVar9 ^ local_148;
    uVar6 = uVar9 << 0x28 | uVar9 >> 0x18;
    local_180 = uVar11 + uVar6 + alStack_b8[*(uint *)((long)blake2b_IV + lVar1 + 0x30)];
    uVar11 = uVar3 + uVar7 + alStack_b8[*(uint *)((long)blake2b_IV + lVar1 + 0x34)];
    uVar4 = uVar4 ^ uVar11;
    uVar3 = uVar4 << 0x20 | uVar4 >> 0x20;
    local_f8[0] = local_f8[0] + uVar3;
    uVar7 = uVar7 ^ local_f8[0];
    uVar4 = uVar7 << 0x28 | uVar7 >> 0x18;
    local_178 = uVar11 + uVar4 + alStack_b8[*(uint *)((long)blake2b_IV + lVar1 + 0x38)];
    uVar7 = uVar8 + uVar5 + alStack_b8[*(uint *)((long)blake2b_IV + lVar1 + 0x3c)];
    uVar2 = uVar2 ^ uVar7;
    uVar11 = uVar2 << 0x20 | uVar2 >> 0x20;
    local_198 = local_198 + uVar11;
    uVar5 = uVar5 ^ local_198;
    uVar2 = uVar5 << 0x28 | uVar5 >> 0x18;
    local_170 = uVar7 + uVar2 + alStack_b8[*(uint *)((long)blake2b_sigma[0] + lVar1)];
    uVar13 = uVar13 ^ local_138[0];
    local_158 = uVar13 << 0x30 | uVar13 >> 0x10;
    local_150 = local_150 + local_158;
    uVar10 = uVar10 ^ local_150;
    local_138[5] = uVar10 << 1 | (ulong)((long)uVar10 < 0);
    uVar12 = uVar12 ^ local_180;
    local_168 = uVar12 << 0x30 | uVar12 >> 0x10;
    local_148 = local_148 + local_168;
    uVar6 = uVar6 ^ local_148;
    local_138[6] = uVar6 << 1 | (ulong)((long)uVar6 < 0);
    uVar3 = uVar3 ^ local_178;
    local_160 = uVar3 << 0x30 | uVar3 >> 0x10;
    local_f8[0] = local_f8[0] + local_160;
    uVar4 = uVar4 ^ local_f8[0];
    local_138[7] = uVar4 << 1 | (ulong)((long)uVar4 < 0);
    uVar11 = uVar11 ^ local_170;
    local_f8[6] = uVar11 << 0x30 | uVar11 >> 0x10;
    local_198 = local_198 + local_f8[6];
    uVar2 = uVar2 ^ local_198;
    local_138[4] = uVar2 << 1 | (ulong)((long)uVar2 < 0);
  }
  local_f8[4] = local_168;
  local_138[1] = local_180;
  local_f8[5] = local_160;
  local_f8[1] = local_198;
  local_138[2] = local_178;
  local_f8[2] = local_150;
  local_138[3] = local_170;
  local_f8[7] = local_158;
  local_f8[3] = local_148;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    S->h[lVar1] = local_138[lVar1] ^ S->h[lVar1] ^ local_f8[lVar1];
  }
  return;
}

Assistant:

static void blake2b_compress(blake2b_state *S, const uint8_t *block) {
	uint64_t m[16];
	uint64_t v[16];
	unsigned int i, r;

	for (i = 0; i < 16; ++i) {
		m[i] = load64(block + i * sizeof(m[i]));
	}

	for (i = 0; i < 8; ++i) {
		v[i] = S->h[i];
	}

	v[8] = blake2b_IV[0];
	v[9] = blake2b_IV[1];
	v[10] = blake2b_IV[2];
	v[11] = blake2b_IV[3];
	v[12] = blake2b_IV[4] ^ S->t[0];
	v[13] = blake2b_IV[5] ^ S->t[1];
	v[14] = blake2b_IV[6] ^ S->f[0];
	v[15] = blake2b_IV[7] ^ S->f[1];

#define G(r, i, a, b, c, d)                                                    \
    do {                                                                       \
        a = a + b + m[blake2b_sigma[r][2 * i + 0]];                            \
        d = rotr64(d ^ a, 32);                                                 \
        c = c + d;                                                             \
        b = rotr64(b ^ c, 24);                                                 \
        a = a + b + m[blake2b_sigma[r][2 * i + 1]];                            \
        d = rotr64(d ^ a, 16);                                                 \
        c = c + d;                                                             \
        b = rotr64(b ^ c, 63);                                                 \
    } while ((void)0, 0)

#define ROUND(r)                                                               \
    do {                                                                       \
        G(r, 0, v[0], v[4], v[8], v[12]);                                      \
        G(r, 1, v[1], v[5], v[9], v[13]);                                      \
        G(r, 2, v[2], v[6], v[10], v[14]);                                     \
        G(r, 3, v[3], v[7], v[11], v[15]);                                     \
        G(r, 4, v[0], v[5], v[10], v[15]);                                     \
        G(r, 5, v[1], v[6], v[11], v[12]);                                     \
        G(r, 6, v[2], v[7], v[8], v[13]);                                      \
        G(r, 7, v[3], v[4], v[9], v[14]);                                      \
    } while ((void)0, 0)

	for (r = 0; r < 12; ++r) {
		ROUND(r);
	}

	for (i = 0; i < 8; ++i) {
		S->h[i] = S->h[i] ^ v[i] ^ v[i + 8];
	}

#undef G
#undef ROUND
}